

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::SnailAllocPages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_00;
  RealCount *pRVar1;
  size_t *psVar2;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar9;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar10;
  char *pcVar11;
  uintptr_t mask;
  ulong uVar12;
  Iterator local_48;
  uint local_34;
  
  iVar6 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar6 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x577,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar5) goto LAB_00705308;
    *puVar8 = 0;
  }
  this_00 = &this->emptySegments;
  if ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
      (this->emptySegments).
      super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base ==
      this_00) {
LAB_00705117:
    pcVar11 = TryAllocDecommittedPages<false>(this,pageCount,pageSegment);
    if (pcVar11 != (char *)0x0) {
      FillAllocPages(this,pcVar11,pageCount);
      return pcVar11;
    }
    uVar7 = this->maxAllocPageCount;
    if (uVar7 < pageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x5a9,"(maxAllocPageCount >= pageCount)","maxAllocPageCount >= pageCount")
      ;
      if (!bVar5) {
LAB_00705308:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
      uVar7 = this->maxAllocPageCount;
    }
    if ((uVar7 - pageCount == 0) ||
       ((ulong)(uVar7 - pageCount) + this->freePageCount <= (ulong)this->maxFreePageCount)) {
      pPVar9 = AddPageSegment(this,this_00);
      if ((pPVar9 != (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) &&
         (pcVar11 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>
                              (pPVar9,pageCount), pcVar11 != (char *)0x0)) goto LAB_007052d7;
    }
    else {
      pPVar9 = AllocPageSegment(&this->decommitSegments,this,false,false,this->enableWriteBarrier);
      if (pPVar9 == (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
        return (char *)0x0;
      }
      pcVar11 = PageSegmentBase<Memory::VirtualAllocWrapper>::
                AllocDecommitPages<BVStatic<272ul>,false>
                          (pPVar9,pageCount,(BVStatic<272UL>)*&(pPVar9->freePages).data,
                           (BVStatic<272UL>)*&(pPVar9->decommitPages).data);
      if (pcVar11 != (char *)0x0) {
        this->decommitPageCount = this->decommitPageCount + (ulong)pPVar9->decommitPageCount;
        FillAllocPages(this,pcVar11,pageCount);
        uVar12 = (ulong)pageCount;
        LogRecommitPages(this,uVar12);
        this->usedBytes = this->usedBytes + uVar12 * 0x1000;
        LOCK();
        totalUsedBytes = totalUsedBytes + uVar12 * 0x1000;
        UNLOCK();
        if (maxUsedBytes < totalUsedBytes) {
          maxUsedBytes = totalUsedBytes;
        }
        if (this->memoryData != (PageMemoryData *)0x0) {
          psVar2 = &this->memoryData->allocPageCount;
          *psVar2 = *psVar2 + uVar12;
        }
        *pageSegment = pPVar9;
        return pcVar11;
      }
    }
    pcVar11 = (char *)0x0;
  }
  else {
    pPVar9 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Head
                       (this_00);
    uVar12 = (ulong)pageCount * 0x1000 - 1;
    local_34 = pageCount;
    if (((ulong)(pPVar9->super_SegmentBase<Memory::VirtualAllocWrapper>).address & uVar12) != 0) {
      local_48.list = this_00;
      local_48.current =
           &this_00->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pDVar10 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)this_00;
      do {
        if (pDVar10 == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_00705308;
          *puVar8 = 0;
          pDVar10 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                    local_48.current;
        }
        pDVar10 = (pDVar10->
                  super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.
                  node;
        pageCount = local_34;
        if (pDVar10 ==
            (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)local_48.list)
        goto LAB_00705117;
        local_48.current =
             &pDVar10->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
        pPVar9 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
                 Iterator::Data(&local_48);
        pDVar10 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                  local_48.current;
      } while (((ulong)(pPVar9->super_SegmentBase<Memory::VirtualAllocWrapper>).address & uVar12) !=
               0);
      pDVar3 = (((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                &(local_48.current)->next)->next).base;
      pDVar10 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                (((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                 &(local_48.current)->next)->prev).base;
      (pDVar10->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.
      base = pDVar3;
      pDVar3->prev = ((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                     &(local_48.current)->next)->prev;
      pDVar3 = (this->emptySegments).
               super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base;
      ((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
      &(local_48.current)->next)->prev = pDVar3->prev;
      (((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
       &(local_48.current)->next)->next).base = pDVar3;
      *(NodeBase **)pDVar3->prev = local_48.current;
      (pDVar3->prev).node =
           (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)local_48.current;
      *(Type *)&(((PageSegmentBase<Memory::VirtualAllocWrapper> *)&(local_48.list)->super_RealCount)
                ->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator
           = *(Type *)&(((PageSegmentBase<Memory::VirtualAllocWrapper> *)
                        &(local_48.list)->super_RealCount)->
                       super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                       allocator - 1;
      pRVar1 = &(this->emptySegments).super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      local_48.current = (NodeBase *)pDVar10;
    }
    pageCount = local_34;
    pcVar11 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>(pPVar9,local_34);
    if (pcVar11 == (char *)0x0) goto LAB_00705117;
LAB_007052d7:
    OnAllocFromNewSegment
              (this,pageCount,pcVar11,&pPVar9->super_SegmentBase<Memory::VirtualAllocWrapper>);
    *pageSegment = pPVar9;
  }
  return pcVar11;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::SnailAllocPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    char * pages = nullptr;
    TPageSegment * newSegment = nullptr;

    if (!emptySegments.Empty())
    {
        newSegment = &emptySegments.Head();

        if (!notPageAligned && !TPageSegment::IsAllocationPageAligned(newSegment->GetAddress(), pageCount))
        {
            newSegment = nullptr;

            // Scan through the empty segments for a segment that can fit this allocation
            FOREACH_DLISTBASE_ENTRY_EDITING(TPageSegment, emptySegment, &this->emptySegments, iter)
            {
                if (TPageSegment::IsAllocationPageAligned(emptySegment.GetAddress(), pageCount))
                {
                    iter.MoveCurrentTo(&this->emptySegments);
                    newSegment = &emptySegment;
                    break;
                }
            }
            NEXT_DLISTBASE_ENTRY_EDITING
        }

        if (newSegment != nullptr)
        {
            pages = newSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                OnAllocFromNewSegment(pageCount, pages, newSegment);
                *pageSegment = newSegment;
                return pages;
            }
        }
    }

    pages = TryAllocDecommittedPages<notPageAligned>(pageCount, pageSegment);
    if (pages != nullptr)
    {
        // TryAllocDecommittedPages may give out a mix of free pages and decommitted pages.
        // Free pages are filled with 0xFE in debug build, so we need to zero them
        // out before giving it out. In release build, free page is already zeroed
        // in ReleasePages
        this->FillAllocPages(pages, pageCount);
        return pages;
    }

    Assert(pages == nullptr);
    Assert(maxAllocPageCount >= pageCount);
    if (maxAllocPageCount != pageCount && (maxFreePageCount < maxAllocPageCount - pageCount + freePageCount))
    {
        // If we exceed the number of max free page count, allocate from a new fully decommit block
        TPageSegment * decommitSegment = AllocPageSegment(
            this->decommitSegments, this, false, false, this->enableWriteBarrier);
        if (decommitSegment == nullptr)
        {
            return nullptr;
        }

        pages = decommitSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount + decommitSegment->GetDecommitPageCount();
#endif
            this->FillAllocPages(pages, pageCount);

            LogRecommitPages(pageCount);
            LogAllocPages(pageCount);

            *pageSegment = decommitSegment;
        }
        return pages;
    }

    // At this point, we haven't been able to allocate either from the
    // decommitted pages, or from the empty segment list, so we'll
    // try allocating a segment. In a page allocator with a pre-reserved segment,
    // we're not allowed to allocate additional segments so return here.
    // Otherwise, add a new segment and allocate from it

    newSegment = AddPageSegment(emptySegments);
    if (newSegment == nullptr)
    {
        return nullptr;
    }

    pages = newSegment->template AllocPages<notPageAligned>(pageCount);
    if (notPageAligned)
    {
        // REVIEW: Is this true for single-chunk allocations too? Are new segments guaranteed to
        // allow for single-chunk allocations to succeed?
        Assert(pages != nullptr);
    }

    if (pages != nullptr)
    {
        OnAllocFromNewSegment(pageCount, pages, newSegment);
        *pageSegment = newSegment;
    }

    return pages;
}